

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void __thiscall RTVector3::normalize(RTVector3 *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->m_data[2] * this->m_data[2] +
          this->m_data[0] * this->m_data[0] + this->m_data[1] * this->m_data[1];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar1 = this->m_data[1];
    this->m_data[0] = this->m_data[0] / fVar2;
    this->m_data[1] = fVar1 / fVar2;
    this->m_data[2] = this->m_data[2] / fVar2;
  }
  return;
}

Assistant:

void RTVector3::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2]);

    if (length == 0)
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
}